

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void simd::ConvertToRgb(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                       uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  uint8_t uVar1;
  uint32_t startXOut_00;
  ImageTemplate<unsigned_char> *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  uint32_t unaff_retaddr;
  uint8_t unaff_retaddr_00;
  uint in_stack_00000008;
  uint32_t in_stack_0000000c;
  SIMDType in_stack_00000010;
  undefined4 in_stack_00000014;
  SIMDType in_stack_00000018;
  uint32_t in_stack_0000001c;
  Image *in_stack_00000020;
  uint32_t nonSimdWidth;
  uint32_t totalSimdWidth;
  uint32_t simdWidth;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint8_t colorCount;
  uint32_t simdSize;
  uint32_t in_stack_000001c0;
  uint32_t in_stack_000001c8;
  uint32_t in_stack_000001d0;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t height_00;
  uint32_t startXIn_00;
  
  startXOut_00 = getSimdSize(in_stack_00000018);
  if (in_stack_00000018 == neon_function) {
    startXOut_00 = 8;
  }
  height_00 = CONCAT13(3,(int3)in_stack_ffffffffffffffd8);
  if (((in_stack_00000018 == cpu_function) || (in_stack_00000018 == avx_function)) ||
     (in_stack_00000008 < startXOut_00)) {
    startXIn_00 = (uint32_t)((ulong)in_RCX >> 0x20);
    if (in_stack_00000018 == avx_function) {
      ConvertToRgb((Image *)CONCAT44(in_ESI,in_EDX),startXIn_00,(uint32_t)in_RCX,
                   (Image *)CONCAT44(in_R8D,in_R9D),startXOut_00,height_00,unaff_retaddr,
                   in_stack_00000008,in_stack_00000010);
    }
    else {
      Image_Function::ConvertToRgb
                ((Image *)CONCAT44(in_ESI,in_EDX),startXIn_00,(uint32_t)in_RCX,
                 (Image *)CONCAT44(in_R8D,in_R9D),startXOut_00,height_00,unaff_retaddr,
                 in_stack_00000008);
    }
  }
  else {
    Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffffc0,(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
               (uint32_t)in_stack_ffffffffffffffb8,
               (ImageTemplate<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffd0,
               height_00);
    Image_Function::VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>
              (in_stack_ffffffffffffffa0);
    uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
    if (uVar1 == '\x03') {
      Image_Function::Copy
                (in_stack_00000020,in_stack_0000001c,in_stack_00000018,
                 (Image *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c,
                 in_stack_00000008,(uint32_t)outYEnd,(uint32_t)outY);
    }
    else {
      PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
      PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
      PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
      PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
      if (in_stack_00000018 == sse_function) {
        sse::ConvertToRgb((uint8_t *)in_stack_00000020,(uint8_t *)CONCAT44(in_stack_0000001c,1),
                          (uint8_t *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c
                          ,in_stack_00000008,unaff_retaddr_00,in_stack_000001c0,in_stack_000001c8,
                          in_stack_000001d0);
      }
    }
  }
  return;
}

Assistant:

void ConvertToRgb( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );
        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;
        
        const uint8_t colorCount = RGB;

        if( (simdType == cpu_function) || (simdType == avx_function) || (width < simdSize) ) {
            AVX_CODE( ConvertToRgb( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::ConvertToRgb( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyRGBImage     ( out );

        if( in.colorCount() == RGB ) {
            Image_Function::Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        SSSE3_CODE( sse::ConvertToRgb( outY, outYEnd, inY, rowSizeOut, rowSizeIn, colorCount, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::ConvertToRgb( outY, outYEnd, inY, rowSizeOut, rowSizeIn, colorCount, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }